

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Read_From_File_And_Create_Bill
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,fstream *inFile
          )

{
  long lVar1;
  long *plVar2;
  pointer pbVar3;
  pointer pbVar4;
  char cVar5;
  istream *piVar6;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  ostream *poVar7;
  int iVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pbVar10;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  string items;
  istringstream ss;
  long local_220;
  value_type local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<Patient,_std::allocator<Patient>_> *local_1e0;
  long local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  lVar1 = *(long *)(*(long *)inFile + -0x18);
  local_1e0 = All_Of_Patients;
  if ((*(uint *)(inFile + lVar1 + 0x20) & 5) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(1);
  }
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar8 = 0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  if ((*(uint *)(inFile + lVar1 + 0x20) & 2) == 0) {
    local_220 = 0;
    do {
      cVar5 = std::ios::widen((char)lVar1 + (char)inFile);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)inFile,(string *)&local_1d0,cVar5);
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      local_1d8 = local_220 * 0x150;
      while( true ) {
        piVar6 = std::operator>>((istream *)local_1b0,(string *)&local_218);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_1f8,&local_218);
        if (iVar8 == 4) {
          this_00 = Patient::Bill_Info_getter_abi_cxx11_
                              ((Patient *)
                               ((long)&(((local_1e0->
                                         super__Vector_base<Patient,_std::allocator<Patient>_>).
                                         _M_impl.super__Vector_impl_data._M_start)->super_Human).Id.
                                       _M_dataplus + local_1d8));
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::push_back(this_00,&local_1f8);
          pbVar4 = local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar3 = local_1f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar8 = -1;
          if (local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar9 = &(local_1f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar9 + -1))->_M_dataplus)._M_p;
              if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar2) {
                operator_delete(plVar2,paVar9->_M_allocated_capacity + 1);
              }
              pbVar10 = (pointer)(paVar9 + 1);
              paVar9 = paVar9 + 2;
            } while (pbVar10 != pbVar4);
            local_1f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
          }
        }
        iVar8 = iVar8 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      local_220 = local_220 + 1;
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      lVar1 = *(long *)(*(long *)inFile + -0x18);
    } while (((byte)inFile[lVar1 + 0x20] & 2) == 0);
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return;
}

Assistant:

void Hospital::Read_From_File_And_Create_Bill (vector<Patient>&All_Of_Patients  , fstream& inFile ){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    vector<string>temp;
    string items;
    int counter=0;
    int Patients_Index=0;

    while(!inFile.eof()) {

        getline(inFile, items);
        istringstream ss(items);
        string word;

        while (ss >> word)
        {
            temp.push_back(word);
            if(counter == 4){
                All_Of_Patients[Patients_Index].Bill_Info_getter().push_back(temp);
                temp.clear();
                counter = -1;
            }
            counter++;
        }
        Patients_Index++;
    }

}